

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O1

Code * __thiscall
r_exec::_TPX::build_mdl_head
          (_TPX *this,HLPBindingMap *bm,uint16_t tpl_arg_count,_Fact *lhs,_Fact *rhs,
          uint16_t *write_index)

{
  uint16_t uVar1;
  int iVar2;
  long *plVar3;
  Code *pCVar4;
  Code *pCVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ushort uVar6;
  Atom local_40 [4];
  Atom local_3c [4];
  Code *local_38;
  
  local_38 = (Code *)rhs;
  plVar3 = (long *)r_code::Mem::Get();
  r_code::Atom::Model((ushort)local_3c,(uchar)Opcodes::Mdl);
  pCVar4 = (Code *)(**(code **)(*plVar3 + 0x50))(plVar3,local_3c);
  r_code::Atom::~Atom(local_3c);
  pCVar5 = BindingMap::abstract_object(&bm->super_BindingMap,(Code *)lhs,false);
  (*(pCVar4->super__Object)._vptr__Object[0x19])(pCVar4,pCVar5);
  pCVar5 = BindingMap::abstract_object(&bm->super_BindingMap,local_38,false);
  (*(pCVar4->super__Object)._vptr__Object[0x19])(pCVar4,pCVar5);
  *write_index = 10;
  *write_index = 0xb;
  r_code::Atom::IPointer((ushort)local_40);
  iVar2 = (*(pCVar4->super__Object)._vptr__Object[4])(pCVar4,1);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar2),local_40);
  r_code::Atom::~Atom(local_40);
  r_code::Atom::Set((uchar)local_40);
  iVar2 = (*(pCVar4->super__Object)._vptr__Object[4])(pCVar4,(ulong)*write_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_00,iVar2),local_40);
  r_code::Atom::~Atom(local_40);
  if (tpl_arg_count != 0) {
    uVar6 = 0;
    do {
      r_code::Atom::VLPointer((ushort)local_40,uVar6);
      uVar1 = *write_index;
      *write_index = uVar1 + 1;
      iVar2 = (*(pCVar4->super__Object)._vptr__Object[4])(pCVar4,(ulong)(ushort)(uVar1 + 1));
      r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar2),local_40);
      r_code::Atom::~Atom(local_40);
      uVar6 = uVar6 + 1;
    } while (tpl_arg_count != uVar6);
  }
  *write_index = *write_index + 1;
  r_code::Atom::IPointer((ushort)local_40);
  iVar2 = (*(pCVar4->super__Object)._vptr__Object[4])(pCVar4,2);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar2),local_40);
  r_code::Atom::~Atom(local_40);
  r_code::Atom::Set((uchar)local_40);
  iVar2 = (*(pCVar4->super__Object)._vptr__Object[4])(pCVar4,(ulong)*write_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar2),local_40);
  r_code::Atom::~Atom(local_40);
  r_code::Atom::RPointer((ushort)local_40);
  uVar1 = *write_index;
  *write_index = uVar1 + 1;
  iVar2 = (*(pCVar4->super__Object)._vptr__Object[4])(pCVar4,(ulong)(ushort)(uVar1 + 1));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar2),local_40);
  r_code::Atom::~Atom(local_40);
  r_code::Atom::RPointer((ushort)local_40);
  uVar1 = *write_index;
  *write_index = uVar1 + 1;
  iVar2 = (*(pCVar4->super__Object)._vptr__Object[4])(pCVar4,(ulong)(ushort)(uVar1 + 1));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_05,iVar2),local_40);
  r_code::Atom::~Atom(local_40);
  return pCVar4;
}

Assistant:

Code *_TPX::build_mdl_head(HLPBindingMap *bm, uint16_t tpl_arg_count, _Fact *lhs, _Fact *rhs, uint16_t &write_index)
{
    Code *mdl = _Mem::Get()->build_object(Atom::Model(Opcodes::Mdl, MDL_ARITY));
    mdl->add_reference(bm->abstract_object(lhs, false)); // reference lhs.
    mdl->add_reference(bm->abstract_object(rhs, false)); // reference rhs.
    write_index = MDL_ARITY;
    mdl->code(MDL_TPL_ARGS) = Atom::IPointer(++write_index);
    mdl->code(write_index) = Atom::Set(tpl_arg_count);

    for (uint16_t i = 0; i < tpl_arg_count; ++i) {
        mdl->code(++write_index) = Atom::VLPointer(i);
    }

    mdl->code(MDL_OBJS) = Atom::IPointer(++write_index);
    mdl->code(write_index) = Atom::Set(2);
    mdl->code(++write_index) = Atom::RPointer(0);
    mdl->code(++write_index) = Atom::RPointer(1);
    return mdl;
}